

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O2

FilenamePattern *
duckdb::FilenamePattern::Deserialize
          (FilenamePattern *__return_storage_ptr__,Deserializer *deserializer)

{
  FilenamePattern(__return_storage_ptr__);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,200,"base",&__return_storage_ptr__->base);
  Deserializer::ReadPropertyWithDefault<unsigned_long>
            (deserializer,0xc9,"pos",&__return_storage_ptr__->pos);
  Deserializer::ReadPropertyWithDefault<bool>
            (deserializer,0xca,"uuid",&__return_storage_ptr__->uuid);
  return __return_storage_ptr__;
}

Assistant:

FilenamePattern FilenamePattern::Deserialize(Deserializer &deserializer) {
	FilenamePattern result;
	deserializer.ReadPropertyWithDefault<string>(200, "base", result.base);
	deserializer.ReadPropertyWithDefault<idx_t>(201, "pos", result.pos);
	deserializer.ReadPropertyWithDefault<bool>(202, "uuid", result.uuid);
	return result;
}